

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O2

auto_ptr<avro::OutputStream> __thiscall
avro::fileOutputStream(avro *this,char *filename,size_t bufferSize)

{
  int iVar1;
  BufferCopyOut *pBVar2;
  BufferCopyOutputStream *this_00;
  Exception *this_01;
  int *piVar3;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> local_118;
  char *local_110;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  
  pBVar2 = (BufferCopyOut *)operator_new(0x10);
  pBVar2->_vptr_BufferCopyOut = (_func_int **)&PTR__FileBufferCopyOut_001a3730;
  iVar1 = open(filename,0x241,0x1a4);
  *(int *)&pBVar2[1]._vptr_BufferCopyOut = iVar1;
  if (-1 < iVar1) {
    this_00 = (BufferCopyOutputStream *)operator_new(0x38);
    local_118._M_ptr = pBVar2;
    BufferCopyOutputStream::BufferCopyOutputStream(this_00,&local_118,bufferSize);
    *(BufferCopyOutputStream **)this = this_00;
    if (local_118._M_ptr != (BufferCopyOut *)0x0) {
      (*(local_118._M_ptr)->_vptr_BufferCopyOut[1])();
    }
    return (auto_ptr<avro::OutputStream>)(OutputStream *)this;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_108,"Cannot open file: %1%");
  piVar3 = __errno_location();
  local_110 = strerror(*piVar3);
  msg = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,char*const&>
                  (&local_108,&local_110);
  Exception::Exception(this_01,msg);
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

auto_ptr<OutputStream> fileOutputStream(const char* filename,
    size_t bufferSize)
{
    auto_ptr<BufferCopyOut> out(new FileBufferCopyOut(filename));
    return auto_ptr<OutputStream>(new BufferCopyOutputStream(out, bufferSize));
}